

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteStream.c
# Opt level: O1

void sysbvm_byteStream_increaseCapacityToAtLeast
               (sysbvm_context_t *context,sysbvm_tuple_t byteStream,size_t requiredCapacity)

{
  ulong uVar1;
  ulong uVar2;
  sysbvm_tuple_t sVar3;
  size_t __n;
  
  uVar2 = *(ulong *)(byteStream + 0x10);
  if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
    __n = (long)uVar2 >> 4;
  }
  else {
    __n = *(size_t *)(uVar2 + 0x10);
  }
  uVar2 = *(ulong *)(byteStream + 0x18);
  if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
    uVar2 = (ulong)*(uint *)(uVar2 + 0xc) * 2;
  }
  else {
    uVar2 = 0;
  }
  uVar1 = 0x10;
  if (0x10 < uVar2) {
    uVar1 = uVar2;
  }
  do {
    uVar2 = uVar1;
    uVar1 = uVar2 * 2;
  } while (uVar2 < requiredCapacity);
  sVar3 = sysbvm_byteArray_create(context,uVar2);
  memcpy((void *)(sVar3 + 0x10),(void *)(*(long *)(byteStream + 0x18) + 0x10),__n);
  *(sysbvm_tuple_t *)(byteStream + 0x18) = sVar3;
  return;
}

Assistant:

static void sysbvm_byteStream_increaseCapacityToAtLeast(sysbvm_context_t *context, sysbvm_tuple_t byteStream, size_t requiredCapacity)
{
    sysbvm_byteStream_t *byteStreamObject = (sysbvm_byteStream_t*)byteStream;
    size_t size = sysbvm_tuple_size_decode(byteStreamObject->size);
    size_t oldCapacity = sysbvm_tuple_getSizeInBytes(byteStreamObject->storage);
    size_t newCapacity = oldCapacity * 2;
    if(newCapacity < 16)
        newCapacity = 16;
    while(newCapacity < requiredCapacity)
        newCapacity *= 2;

    sysbvm_object_tuple_t *newStorage = (sysbvm_object_tuple_t*)sysbvm_byteArray_create(context, newCapacity);
    sysbvm_object_tuple_t *oldStorage = (sysbvm_object_tuple_t*)byteStreamObject->storage;
    memcpy(newStorage->bytes, oldStorage->bytes, size);
    byteStreamObject->storage = (sysbvm_tuple_t)newStorage;
}